

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool ctemplate::anon_unknown_14::PragmaMarker::IsValidAttribute
               (PragmaId pragma_id,char *name,size_t namelen)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    __s = *(char **)(&DAT_0014d2b0 + lVar4 * 8 + (ulong)pragma_id * 0x20);
    if (__s == (char *)0x0) {
      iVar2 = 2;
LAB_0011eec1:
      bVar1 = false;
    }
    else {
      sVar3 = strlen(__s);
      if (sVar3 == namelen) {
        iVar2 = strncasecmp(__s,name,namelen);
        if (iVar2 == 0) {
          iVar2 = 1;
          goto LAB_0011eec1;
        }
      }
      iVar2 = 0;
      bVar1 = true;
    }
    if (!bVar1) goto LAB_0011eed5;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  iVar2 = 2;
LAB_0011eed5:
  return iVar2 != 2;
}

Assistant:

bool PragmaMarker::IsValidAttribute(PragmaId pragma_id, const char* name,
                                    size_t namelen) {
  const int kMaxAttributes = sizeof(g_pragmas[0].attribute_names) /
      sizeof(*g_pragmas[0].attribute_names);
  for (int i = 0; i < kMaxAttributes; ++i) {
    const char* attr_name = g_pragmas[pragma_id].attribute_names[i];
    if (attr_name == NULL)
      break;
    if ((strlen(attr_name) == namelen) &&
        (strncasecmp(attr_name, name, namelen) == 0))
      // We found the given name in our accepted attribute list.
      return true;
  }
  return false;  // We did not find the name.
}